

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderGetProgramiv3Test::iterate(GeometryShaderGetProgramiv3Test *this)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  pointer p_Var3;
  _Alloc_hider so_body;
  bool bVar4;
  bool bVar5;
  int iVar6;
  GLuint GVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  MessageBuilder *pMVar10;
  NotSupportedError *this_00;
  TestContext **ppTVar11;
  uint uVar12;
  qpTestResult testResult;
  char *pcVar13;
  _run *run;
  GLint result_geometry_linked_vertices_out;
  TestContext **local_270;
  int local_264;
  GLint result_geometry_shader_invocations;
  GLint result_geometry_linked_output_type;
  GLint result_geometry_linked_input_type;
  GLint gs_spo_id;
  GLuint *local_250;
  GLuint *local_248;
  GLuint *local_240;
  char *gs_code_raw;
  string gs_code_specialized;
  string gs_code;
  string dummy_vs_specialized;
  string dummy_fs_specialized;
  undefined1 local_1b0 [384];
  long lVar9;
  
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  gs_spo_id = 0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x3ce);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  TestCaseBase::specializeShader_abi_cxx11_
            (&dummy_fs_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  TestCaseBase::specializeShader_abi_cxx11_
            (&dummy_vs_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  GVar7 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar7;
  GVar7 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar7;
  GVar7 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar7;
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x3dd);
  bVar4 = buildShader(this,this->m_fs_id,dummy_fs_specialized._M_dataplus._M_p);
  if ((bVar4) &&
     (bVar4 = buildShader(this,this->m_vs_id,dummy_vs_specialized._M_dataplus._M_p), bVar4)) {
    GVar7 = (**(code **)(lVar9 + 0x3c8))();
    this->m_po_id = GVar7;
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ea);
    (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_gs_id);
    (**(code **)(lVar9 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glAttachShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x3ef);
    local_248 = &this->m_fs_po_id;
    bVar4 = buildShaderProgram(this,local_248,0x8b30,dummy_fs_specialized._M_dataplus._M_p);
    if (!bVar4) {
LAB_00ccf346:
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Either FS or VS SPOs failed to build.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ccf2fb;
    }
    pcVar13 = (char *)&this->m_vs_po_id;
    local_250 = (GLuint *)pcVar13;
    bVar4 = buildShaderProgram(this,(GLuint *)pcVar13,0x8b31,dummy_vs_specialized._M_dataplus._M_p);
    if (!bVar4) goto LAB_00ccf346;
    initTestRuns(this);
    local_240 = &this->m_gs_po_id;
    local_270 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    bVar4 = true;
    iVar6 = 0;
    while (iVar6 != 2) {
      uVar12 = 0;
      local_264 = iVar6;
      while( true ) {
        p_Var3 = (this->_runs).
                 super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_runs).
                          super__Vector_base<glcts::GeometryShaderGetProgramiv3Test::_run,_std::allocator<glcts::GeometryShaderGetProgramiv3Test::_run>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var3 >> 4) <=
            (ulong)uVar12) break;
        run = p_Var3 + uVar12;
        getGSCode_abi_cxx11_(&gs_code,(GeometryShaderGetProgramiv3Test *)pcVar13,run);
        gs_code_raw = gs_code._M_dataplus._M_p;
        TestCaseBase::specializeShader_abi_cxx11_
                  (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code_raw);
        so_body = gs_code_specialized._M_dataplus;
        if (local_264 == 0) {
          (**(code **)(lVar9 + 0x98))(0);
          dVar8 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar8,"glBindProgramPipeline() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x422);
          bVar5 = buildShader(this,this->m_gs_id,so_body._M_p);
          if (bVar5) {
            result_geometry_linked_vertices_out = 0;
            (**(code **)(lVar9 + 0xce8))(this->m_po_id);
            dVar8 = (**(code **)(lVar9 + 0x800))();
            glu::checkError(dVar8,"glLinkProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x432);
            (**(code **)(lVar9 + 0x9d8))(this->m_po_id,0x8b82,&result_geometry_linked_vertices_out);
            if (result_geometry_linked_vertices_out != 0) {
              (**(code **)(lVar9 + 0x1680))(this->m_po_id);
              dVar8 = (**(code **)(lVar9 + 0x800))();
              glu::checkError(dVar8,"glUseProgram() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                              ,0x441);
              goto LAB_00ccee40;
            }
            local_1b0._0_8_ = (*local_270)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),"Test program object failed to link");
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_1b0._0_8_ = (*local_270)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),"Failed to compile a geometry shader object."
                           );
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
LAB_00ccf27f:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          bVar4 = false;
          bVar5 = false;
        }
        else {
          deinitSPOs(this,false);
          bVar5 = buildShaderProgram(this,local_240,0x8dd9,so_body._M_p);
          if (!bVar5) {
            local_1b0._0_8_ = (*local_270)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::operator<<((ostream *)(local_1b0 + 8),
                            "Failed to compile a geometry shader program object");
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00ccf27f;
          }
LAB_00ccee40:
          GVar7 = (&this->m_gs_po_id)[(ulong)(local_264 == 0) * 2];
          result_geometry_linked_vertices_out = 0;
          result_geometry_linked_input_type = 0;
          result_geometry_linked_output_type = 0;
          result_geometry_shader_invocations = 0;
          (**(code **)(lVar9 + 0x9d8))
                    (GVar7,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT,
                     &result_geometry_linked_vertices_out);
          dVar8 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar8,
                          "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query."
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x44d);
          (**(code **)(lVar9 + 0x9d8))
                    (GVar7,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
                     &result_geometry_linked_input_type);
          dVar8 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar8,
                          "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x451);
          (**(code **)(lVar9 + 0x9d8))
                    (GVar7,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
                     &result_geometry_linked_output_type);
          dVar8 = (**(code **)(lVar9 + 0x800))();
          glu::checkError(dVar8,
                          "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query."
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x455);
          (**(code **)(lVar9 + 0x9d8))
                    (GVar7,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS,
                     &result_geometry_shader_invocations);
          dVar8 = (**(code **)(lVar9 + 0x800))();
          pcVar13 = "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.";
          glu::checkError(dVar8,
                          "glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query."
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x459);
          if (run->input_primitive_type != result_geometry_linked_input_type) {
            local_1b0._0_8_ = (*local_270)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value ");
            std::operator<<((ostream *)poVar2,"[");
            std::ostream::operator<<(poVar2,result_geometry_linked_input_type);
            std::operator<<((ostream *)poVar2,"] does not match the test run setting [");
            pMVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,&run->input_primitive_type);
            std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]"
                           );
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            bVar4 = false;
          }
          if (run->invocations != result_geometry_shader_invocations) {
            local_1b0._0_8_ = (*local_270)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value ");
            std::operator<<((ostream *)poVar2,"[");
            std::ostream::operator<<(poVar2,result_geometry_shader_invocations);
            std::operator<<((ostream *)poVar2,"] does not match the test run setting [");
            pMVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,&run->input_primitive_type);
            std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]"
                           );
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            bVar4 = false;
          }
          if (run->max_vertices != result_geometry_linked_vertices_out) {
            local_1b0._0_8_ = (*local_270)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"GL_GEOMETRY_LINKED_VERTICES_OUT query value ");
            std::operator<<((ostream *)poVar2,"[");
            std::ostream::operator<<(poVar2,result_geometry_linked_vertices_out);
            std::operator<<((ostream *)poVar2,"] does not match the test run setting [");
            pMVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,&run->max_vertices);
            std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]"
                           );
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            bVar4 = false;
          }
          if (run->output_primitive_type != result_geometry_linked_output_type) {
            local_1b0._0_8_ = (*local_270)->m_log;
            poVar2 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,"GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value ");
            std::operator<<((ostream *)poVar2,"[");
            std::ostream::operator<<(poVar2,result_geometry_linked_output_type);
            std::operator<<((ostream *)poVar2,"] does not match the test run setting [");
            pMVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_1b0,&run->output_primitive_type);
            std::operator<<(&(pMVar10->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]"
                           );
            pcVar13 = &tcu::TestLog::EndMessage;
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            bVar4 = false;
          }
          bVar5 = true;
        }
        std::__cxx11::string::~string((string *)&gs_code_specialized);
        std::__cxx11::string::~string((string *)&gs_code);
        uVar12 = uVar12 + 1;
        if (!bVar5) goto LAB_00ccf4bf;
      }
      iVar6 = local_264 + 1;
    }
    pGVar1 = &this->m_pipeline_object_id;
    (**(code **)(lVar9 + 0x6d8))(1,pGVar1);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGenProgramPipelines() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x490);
    (**(code **)(lVar9 + 0x1688))(*pGVar1,2,*local_248);
    (**(code **)(lVar9 + 0x1688))(*pGVar1,1,*local_250);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glUseProgramStages() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x494);
    (**(code **)(lVar9 + 0x9a0))
              (this->m_pipeline_object_id,(this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER,
               &gs_spo_id);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetProgramPipelineiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x497);
    if (gs_spo_id != 0) {
      local_1b0._0_8_ = (*local_270)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Pipeline object reported [");
      std::ostream::operator<<(poVar2,gs_spo_id);
      std::operator<<((ostream *)poVar2,"]");
      std::operator<<((ostream *)poVar2,
                      " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ccf2fb;
    }
LAB_00ccf4bf:
    if (bVar4) {
      pcVar13 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      ppTVar11 = local_270;
      goto LAB_00ccf30e;
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Either FS or VS failed to build.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ccf2fb:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  }
  testResult = QP_TEST_RESULT_FAIL;
  ppTVar11 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  pcVar13 = "Fail";
LAB_00ccf30e:
  tcu::TestContext::setTestResult(*ppTVar11,testResult,pcVar13);
  std::__cxx11::string::~string((string *)&dummy_vs_specialized);
  std::__cxx11::string::~string((string *)&dummy_fs_specialized);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramiv3Test::iterate()
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gs_spo_id				  = 0;
	unsigned int		  n_run					  = 0;
	unsigned int		  n_separable_object_case = 0;
	bool				  result				  = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Prepare specialized versions of dummy fragment & vertex shaders */
	std::string dummy_fs_specialized = specializeShader(1,
														/* parts */ &dummy_fs_code);
	const char* dummy_fs_specialized_raw = dummy_fs_specialized.c_str();
	std::string dummy_vs_specialized	 = specializeShader(1, &dummy_vs_code);
	const char* dummy_vs_specialized_raw = dummy_vs_specialized.c_str();

	/* Set up the fragment & the vertex shaders */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	if (!buildShader(m_fs_id, dummy_fs_specialized_raw) || !buildShader(m_vs_id, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS failed to build." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up the test program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_gs_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* Set up the fragment & the vertex shader programs */
	if (!buildShaderProgram(&m_fs_po_id, GL_FRAGMENT_SHADER, dummy_fs_specialized_raw) ||
		!buildShaderProgram(&m_vs_po_id, GL_VERTEX_SHADER, dummy_vs_specialized_raw))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Either FS or VS SPOs failed to build."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up test runs */
	initTestRuns();

	/* The test should check both a geometry shader program object and a full-blown PO
	 * consisting of FS, GS and VS. */
	for (n_separable_object_case = 0; n_separable_object_case < 2; /* PO, SPO cases */
		 ++n_separable_object_case)
	{
		bool should_use_separable_object = (n_separable_object_case != 0);

		/* Iterate over all test runs */
		for (n_run = 0; n_run < _runs.size(); ++n_run)
		{
			const _run& current_run			= _runs[n_run];
			std::string gs_code				= getGSCode(current_run);
			const char* gs_code_raw			= gs_code.c_str();
			std::string gs_code_specialized = specializeShader(1, /* parts */
															   &gs_code_raw);
			const char* gs_code_specialized_raw = gs_code_specialized.c_str();

			if (should_use_separable_object)
			{
				/* Deinitialize any objects that may have been created in previous iterations */
				deinitSPOs(false);

				/* Set up the geometry shader program object */
				if (!buildShaderProgram(&m_gs_po_id, GL_GEOMETRY_SHADER, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader program object"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* if (should_use_pipeline_object) */
			else
			{
				gl.bindProgramPipeline(0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

				/* Set up the geometry shader object */
				if (!buildShader(m_gs_id, gs_code_specialized_raw))
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Failed to compile a geometry shader object."
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Set up the program object */
				glw::GLint link_status = GL_FALSE;

				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);

				if (link_status == GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Test program object failed to link"
									   << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}

				/* Bind the PO to the rendering context */
				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");
			}

			/* Execute the queries */
			glw::GLuint po_id								= (should_use_separable_object) ? m_gs_po_id : m_po_id;
			glw::GLint  result_geometry_linked_vertices_out = 0;
			glw::GLint  result_geometry_linked_input_type   = 0;
			glw::GLint  result_geometry_linked_output_type  = 0;
			glw::GLint  result_geometry_shader_invocations  = 0;

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, &result_geometry_linked_vertices_out);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_VERTICES_OUT_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE, &result_geometry_linked_input_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE, &result_geometry_linked_output_type);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query.");

			gl.getProgramiv(po_id, m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS, &result_geometry_shader_invocations);
			GLU_EXPECT_NO_ERROR(gl.getError(),
								"glGetProgramiv() call failed for GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query.");

			if (current_run.input_primitive_type != (glw::GLenum)result_geometry_linked_input_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_INPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_input_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.invocations != result_geometry_shader_invocations)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_SHADER_INVOCATIONS_EXT query value "
								   << "[" << result_geometry_shader_invocations
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.input_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.max_vertices != result_geometry_linked_vertices_out)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_VERTICES_OUT query value "
								   << "[" << result_geometry_linked_vertices_out
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.max_vertices << "]" << tcu::TestLog::EndMessage;

				result = false;
			}

			if (current_run.output_primitive_type != (glw::GLenum)result_geometry_linked_output_type)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT query value "
								   << "[" << result_geometry_linked_output_type
								   << "]"
									  " does not match the test run setting "
									  "["
								   << current_run.output_primitive_type << "]" << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all test runs) */
	}	 /* for (PO & SPO cases) */

	/* One more check: build a pipeline object which only defines a FS & VS stages,
	 *                 and check what GS SPO ID the object reports. */
	gl.genProgramPipelines(1, &m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.useProgramStages(m_pipeline_object_id, GL_FRAGMENT_SHADER_BIT, m_fs_po_id);
	gl.useProgramStages(m_pipeline_object_id, GL_VERTEX_SHADER_BIT, m_vs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() call failed.");

	gl.getProgramPipelineiv(m_pipeline_object_id, m_glExtTokens.GEOMETRY_SHADER, &gs_spo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() call failed.");

	if (gs_spo_id != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Pipeline object reported [" << gs_spo_id << "]"
						   << " for GL_GEOMETRY_SHADER_EXT query, even though no GS SPO was bound."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}